

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ulong uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 (*pauVar53) [16];
  uint uVar54;
  uint uVar55;
  undefined1 (*pauVar56) [16];
  long lVar57;
  ulong uVar58;
  RTCRayQueryContext *pRVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  float fVar66;
  float fVar73;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar71;
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar70 [64];
  float fVar77;
  undefined1 auVar78 [16];
  float fVar84;
  undefined1 auVar80 [32];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar85;
  undefined1 auVar83 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar93;
  float fVar105;
  float fVar106;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar99 [32];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  float fVar107;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar98 [16];
  undefined1 auVar104 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  float fVar115;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar119 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar143 [64];
  float fVar162;
  float fVar163;
  undefined1 auVar164 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar165 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [64];
  float fVar188;
  float fVar189;
  undefined1 auVar190 [32];
  float fVar194;
  float fVar196;
  float fVar198;
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar195;
  float fVar197;
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar192 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1504;
  undefined8 local_1500;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined1 local_14e0 [8];
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [8];
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  RTCFilterFunctionNArguments local_1498;
  long local_1468;
  Scene *local_1460;
  ulong local_1458;
  float local_1450;
  float local_144c;
  float local_1448;
  undefined4 local_1444;
  undefined4 local_1440;
  undefined4 local_143c;
  uint local_1438;
  uint local_1434;
  uint local_1430;
  undefined1 local_1420 [32];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar56 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar78 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar86 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar67 = vandps_avx((undefined1  [16])aVar3,auVar67);
    auVar98._8_4_ = 0x219392ef;
    auVar98._0_8_ = 0x219392ef219392ef;
    auVar98._12_4_ = 0x219392ef;
    auVar67 = vcmpps_avx(auVar67,auVar98,1);
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar98 = vdivps_avx(auVar116,(undefined1  [16])aVar3);
    auVar117._8_4_ = 0x5d5e0b6b;
    auVar117._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar117._12_4_ = 0x5d5e0b6b;
    auVar67 = vblendvps_avx(auVar98,auVar117,auVar67);
    auVar111._0_4_ = auVar67._0_4_ * 0.99999964;
    auVar111._4_4_ = auVar67._4_4_ * 0.99999964;
    auVar111._8_4_ = auVar67._8_4_ * 0.99999964;
    auVar111._12_4_ = auVar67._12_4_ * 0.99999964;
    auVar94._0_4_ = auVar67._0_4_ * 1.0000004;
    auVar94._4_4_ = auVar67._4_4_ * 1.0000004;
    auVar94._8_4_ = auVar67._8_4_ * 1.0000004;
    auVar94._12_4_ = auVar67._12_4_ * 1.0000004;
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1310._4_4_ = uVar2;
    local_1310._0_4_ = uVar2;
    local_1310._8_4_ = uVar2;
    local_1310._12_4_ = uVar2;
    auVar138 = ZEXT1664(local_1310);
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1320._4_4_ = uVar2;
    local_1320._0_4_ = uVar2;
    local_1320._8_4_ = uVar2;
    local_1320._12_4_ = uVar2;
    auVar143 = ZEXT1664(local_1320);
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1330._4_4_ = uVar2;
    local_1330._0_4_ = uVar2;
    local_1330._8_4_ = uVar2;
    local_1330._12_4_ = uVar2;
    auVar165 = ZEXT1664(local_1330);
    local_1340 = vshufps_avx(auVar111,auVar111,0);
    auVar179 = ZEXT1664(local_1340);
    auVar67 = vmovshdup_avx(auVar111);
    local_1350 = vshufps_avx(auVar111,auVar111,0x55);
    auVar181 = ZEXT1664(local_1350);
    auVar98 = vshufpd_avx(auVar111,auVar111,1);
    local_1360 = vshufps_avx(auVar111,auVar111,0xaa);
    auVar192 = ZEXT1664(local_1360);
    local_1370 = vshufps_avx(auVar94,auVar94,0);
    auVar206 = ZEXT1664(local_1370);
    local_1380 = vshufps_avx(auVar94,auVar94,0x55);
    auVar208 = ZEXT1664(local_1380);
    local_1390 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar210 = ZEXT1664(local_1390);
    uVar62 = (ulong)(auVar111._0_4_ < 0.0) * 0x10;
    uVar64 = (ulong)(auVar67._0_4_ < 0.0) << 4 | 0x20;
    uVar65 = (ulong)(auVar98._0_4_ < 0.0) << 4 | 0x40;
    local_1458 = uVar62 ^ 0x10;
    local_13f0 = vshufps_avx(auVar78,auVar78,0);
    auVar135 = ZEXT1664(local_13f0);
    auVar67 = vshufps_avx(auVar86,auVar86,0);
    auVar70 = ZEXT1664(auVar67);
    local_1100._16_16_ = mm_lookupmask_ps._240_16_;
    local_1100._0_16_ = mm_lookupmask_ps._0_16_;
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar80._8_4_ = 0xbf800000;
    auVar80._0_8_ = 0xbf800000bf800000;
    auVar80._12_4_ = 0xbf800000;
    auVar80._16_4_ = 0xbf800000;
    auVar80._20_4_ = 0xbf800000;
    auVar80._24_4_ = 0xbf800000;
    auVar80._28_4_ = 0xbf800000;
    _local_1120 = vblendvps_avx(auVar99,auVar80,local_1100);
LAB_011e1c9d:
    do {
      pauVar53 = pauVar56 + -1;
      pauVar56 = pauVar56 + -1;
      if (*(float *)(*pauVar53 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar61 = *(ulong *)*pauVar56;
        while ((uVar61 & 8) == 0) {
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar62),auVar138._0_16_);
          auVar78._0_4_ = auVar179._0_4_ * auVar67._0_4_;
          auVar78._4_4_ = auVar179._4_4_ * auVar67._4_4_;
          auVar78._8_4_ = auVar179._8_4_ * auVar67._8_4_;
          auVar78._12_4_ = auVar179._12_4_ * auVar67._12_4_;
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar64),auVar143._0_16_);
          auVar86._0_4_ = auVar181._0_4_ * auVar67._0_4_;
          auVar86._4_4_ = auVar181._4_4_ * auVar67._4_4_;
          auVar86._8_4_ = auVar181._8_4_ * auVar67._8_4_;
          auVar86._12_4_ = auVar181._12_4_ * auVar67._12_4_;
          auVar67 = vmaxps_avx(auVar78,auVar86);
          auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar65),auVar165._0_16_);
          auVar87._0_4_ = auVar192._0_4_ * auVar98._0_4_;
          auVar87._4_4_ = auVar192._4_4_ * auVar98._4_4_;
          auVar87._8_4_ = auVar192._8_4_ * auVar98._8_4_;
          auVar87._12_4_ = auVar192._12_4_ * auVar98._12_4_;
          auVar98 = vmaxps_avx(auVar87,auVar135._0_16_);
          auVar98 = vmaxps_avx(auVar67,auVar98);
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + local_1458),auVar138._0_16_);
          auVar88._0_4_ = auVar206._0_4_ * auVar67._0_4_;
          auVar88._4_4_ = auVar206._4_4_ * auVar67._4_4_;
          auVar88._8_4_ = auVar206._8_4_ * auVar67._8_4_;
          auVar88._12_4_ = auVar206._12_4_ * auVar67._12_4_;
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar64 ^ 0x10)),
                               auVar143._0_16_);
          auVar95._0_4_ = auVar208._0_4_ * auVar67._0_4_;
          auVar95._4_4_ = auVar208._4_4_ * auVar67._4_4_;
          auVar95._8_4_ = auVar208._8_4_ * auVar67._8_4_;
          auVar95._12_4_ = auVar208._12_4_ * auVar67._12_4_;
          auVar67 = vminps_avx(auVar88,auVar95);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar65 ^ 0x10)),
                               auVar165._0_16_);
          auVar96._0_4_ = auVar210._0_4_ * auVar78._0_4_;
          auVar96._4_4_ = auVar210._4_4_ * auVar78._4_4_;
          auVar96._8_4_ = auVar210._8_4_ * auVar78._8_4_;
          auVar96._12_4_ = auVar210._12_4_ * auVar78._12_4_;
          auVar78 = vminps_avx(auVar96,auVar70._0_16_);
          auVar67 = vminps_avx(auVar67,auVar78);
          auVar67 = vcmpps_avx(auVar98,auVar67,2);
          uVar60 = vmovmskps_avx(auVar67);
          local_12e0._0_16_ = auVar98;
          if (uVar60 == 0) {
            if (pauVar56 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_011e1c9d;
          }
          uVar60 = uVar60 & 0xff;
          uVar58 = uVar61 & 0xfffffffffffffff0;
          lVar63 = 0;
          if (uVar60 != 0) {
            for (; (uVar60 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
            }
          }
          uVar61 = *(ulong *)(uVar58 + lVar63 * 8);
          uVar60 = uVar60 - 1 & uVar60;
          if (uVar60 != 0) {
            uVar55 = *(uint *)(local_12e0 + lVar63 * 4);
            lVar63 = 0;
            if (uVar60 != 0) {
              for (; (uVar60 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
              }
            }
            uVar4 = *(ulong *)(uVar58 + lVar63 * 8);
            uVar54 = *(uint *)(local_12e0 + lVar63 * 4);
            uVar60 = uVar60 - 1 & uVar60;
            if (uVar60 == 0) {
              if (uVar55 < uVar54) {
                *(ulong *)*pauVar56 = uVar4;
                *(uint *)(*pauVar56 + 8) = uVar54;
                pauVar56 = pauVar56 + 1;
              }
              else {
                *(ulong *)*pauVar56 = uVar61;
                *(uint *)(*pauVar56 + 8) = uVar55;
                pauVar56 = pauVar56 + 1;
                uVar61 = uVar4;
              }
            }
            else {
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar61;
              auVar67 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar55));
              auVar89._8_8_ = 0;
              auVar89._0_8_ = uVar4;
              auVar98 = vpunpcklqdq_avx(auVar89,ZEXT416(uVar54));
              lVar63 = 0;
              if (uVar60 != 0) {
                for (; (uVar60 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
                }
              }
              auVar97._8_8_ = 0;
              auVar97._0_8_ = *(ulong *)(uVar58 + lVar63 * 8);
              auVar86 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_12e0 + lVar63 * 4)));
              auVar78 = vpcmpgtd_avx(auVar98,auVar67);
              uVar60 = uVar60 - 1 & uVar60;
              if (uVar60 == 0) {
                auVar94 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar98,auVar67,auVar94);
                auVar67 = vblendvps_avx(auVar67,auVar98,auVar94);
                auVar98 = vpcmpgtd_avx(auVar86,auVar78);
                auVar94 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar86,auVar78,auVar94);
                auVar78 = vblendvps_avx(auVar78,auVar86,auVar94);
                auVar86 = vpcmpgtd_avx(auVar78,auVar67);
                auVar94 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar78,auVar67,auVar94);
                auVar67 = vblendvps_avx(auVar67,auVar78,auVar94);
                *pauVar56 = auVar67;
                pauVar56[1] = auVar86;
                uVar61 = auVar98._0_8_;
                pauVar56 = pauVar56 + 2;
              }
              else {
                lVar63 = 0;
                if (uVar60 != 0) {
                  for (; (uVar60 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
                  }
                }
                auVar118._8_8_ = 0;
                auVar118._0_8_ = *(ulong *)(uVar58 + lVar63 * 8);
                auVar111 = vpunpcklqdq_avx(auVar118,ZEXT416(*(uint *)(local_12e0 + lVar63 * 4)));
                auVar94 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar98,auVar67,auVar94);
                auVar67 = vblendvps_avx(auVar67,auVar98,auVar94);
                auVar98 = vpcmpgtd_avx(auVar111,auVar86);
                auVar94 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar111,auVar86,auVar94);
                auVar86 = vblendvps_avx(auVar86,auVar111,auVar94);
                auVar94 = vpcmpgtd_avx(auVar86,auVar67);
                auVar111 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar86,auVar67,auVar111);
                auVar67 = vblendvps_avx(auVar67,auVar86,auVar111);
                auVar86 = vpcmpgtd_avx(auVar98,auVar78);
                auVar111 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar98,auVar78,auVar111);
                auVar98 = vblendvps_avx(auVar78,auVar98,auVar111);
                auVar78 = vpcmpgtd_avx(auVar94,auVar98);
                auVar111 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar94,auVar98,auVar111);
                auVar98 = vblendvps_avx(auVar98,auVar94,auVar111);
                *pauVar56 = auVar67;
                pauVar56[1] = auVar98;
                pauVar56[2] = auVar78;
                auVar135 = ZEXT1664(local_13f0);
                uVar61 = auVar86._0_8_;
                pauVar56 = pauVar56 + 3;
              }
            }
          }
        }
        local_1468 = (ulong)((uint)uVar61 & 0xf) - 8;
        if (local_1468 != 0) {
          uVar61 = uVar61 & 0xfffffffffffffff0;
          lVar63 = 0;
          do {
            lVar57 = lVar63 * 0x60;
            local_1460 = context->scene;
            ppfVar5 = (context->scene->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar61 + 0x40 + lVar57)];
            pfVar7 = ppfVar5[*(uint *)(uVar61 + 0x44 + lVar57)];
            pfVar8 = ppfVar5[*(uint *)(uVar61 + 0x48 + lVar57)];
            pfVar9 = ppfVar5[*(uint *)(uVar61 + 0x4c + lVar57)];
            auVar78 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar61 + lVar57)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar61 + 8 + lVar57)))
            ;
            auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar61 + lVar57)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar61 + 8 + lVar57)))
            ;
            auVar86 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar61 + 4 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0xc + lVar57)));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar61 + 4 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0xc + lVar57)));
            auVar111 = vunpcklps_avx(auVar67,auVar98);
            auVar116 = vunpcklps_avx(auVar78,auVar86);
            auVar67 = vunpckhps_avx(auVar78,auVar86);
            auVar86 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar61 + 0x10 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar61 + 0x18 + lVar57)));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar61 + 0x10 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar61 + 0x18 + lVar57)));
            auVar94 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar61 + 0x14 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0x1c + lVar57)));
            auVar78 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar61 + 0x14 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0x1c + lVar57)));
            auVar117 = vunpcklps_avx(auVar98,auVar78);
            auVar87 = vunpcklps_avx(auVar86,auVar94);
            auVar98 = vunpckhps_avx(auVar86,auVar94);
            auVar94 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar61 + 0x20 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar61 + 0x28 + lVar57)));
            auVar78 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar61 + 0x20 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar61 + 0x28 + lVar57)));
            auVar88 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar61 + 0x24 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0x2c + lVar57)));
            auVar86 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar61 + 0x24 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0x2c + lVar57)));
            auVar95 = vunpcklps_avx(auVar78,auVar86);
            auVar96 = vunpcklps_avx(auVar94,auVar88);
            auVar78 = vunpckhps_avx(auVar94,auVar88);
            auVar88 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar61 + 0x30 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar61 + 0x38 + lVar57)));
            auVar86 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar61 + 0x30 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar61 + 0x38 + lVar57)));
            auVar79 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar61 + 0x34 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0x3c + lVar57)));
            auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar61 + 0x34 + lVar57)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar61 + 0x3c + lVar57)));
            auVar94 = vunpcklps_avx(auVar86,auVar94);
            auVar89 = vunpcklps_avx(auVar88,auVar79);
            lVar1 = uVar61 + 0x40 + lVar57;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            auVar86 = vunpckhps_avx(auVar88,auVar79);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar57 = uVar61 + 0x50 + lVar57;
            local_1300 = *(undefined8 *)(lVar57 + 0x10);
            uStack_12f8 = *(undefined8 *)(lVar57 + 0x18);
            uStack_12f0 = local_1300;
            uStack_12e8 = uStack_12f8;
            auVar119._16_16_ = auVar96;
            auVar119._0_16_ = auVar116;
            auVar136._16_16_ = auVar78;
            auVar136._0_16_ = auVar67;
            auVar81._16_16_ = auVar95;
            auVar81._0_16_ = auVar111;
            auVar133._16_16_ = auVar87;
            auVar133._0_16_ = auVar87;
            auVar164._16_16_ = auVar98;
            auVar164._0_16_ = auVar98;
            auVar90._16_16_ = auVar117;
            auVar90._0_16_ = auVar117;
            auVar178._16_16_ = auVar89;
            auVar178._0_16_ = auVar89;
            auVar142._16_16_ = auVar86;
            auVar142._0_16_ = auVar86;
            auVar100._16_16_ = auVar94;
            auVar100._0_16_ = auVar94;
            uVar2 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar190._4_4_ = uVar2;
            auVar190._0_4_ = uVar2;
            auVar190._8_4_ = uVar2;
            auVar190._12_4_ = uVar2;
            auVar190._16_4_ = uVar2;
            auVar190._20_4_ = uVar2;
            auVar190._24_4_ = uVar2;
            auVar190._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar205._4_4_ = uVar2;
            auVar205._0_4_ = uVar2;
            auVar205._8_4_ = uVar2;
            auVar205._12_4_ = uVar2;
            auVar205._16_4_ = uVar2;
            auVar205._20_4_ = uVar2;
            auVar205._24_4_ = uVar2;
            auVar205._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar207._4_4_ = uVar2;
            auVar207._0_4_ = uVar2;
            auVar207._8_4_ = uVar2;
            auVar207._12_4_ = uVar2;
            auVar207._16_4_ = uVar2;
            auVar207._20_4_ = uVar2;
            auVar207._24_4_ = uVar2;
            auVar207._28_4_ = uVar2;
            local_13e0 = vsubps_avx(auVar119,auVar190);
            local_13c0 = vsubps_avx(auVar136,auVar205);
            local_fe0 = vsubps_avx(auVar81,auVar207);
            auVar80 = vsubps_avx(auVar133,auVar190);
            auVar99 = vsubps_avx(auVar164,auVar205);
            auVar18 = vsubps_avx(auVar90,auVar207);
            auVar19 = vsubps_avx(auVar178,auVar190);
            auVar20 = vsubps_avx(auVar142,auVar205);
            auVar21 = vsubps_avx(auVar100,auVar207);
            local_1000 = vsubps_avx(auVar19,local_13e0);
            local_1020 = vsubps_avx(auVar20,local_13c0);
            local_1040 = vsubps_avx(auVar21,local_fe0);
            fVar11 = local_13c0._0_4_;
            fVar114 = auVar20._0_4_ + fVar11;
            fVar12 = local_13c0._4_4_;
            fVar120 = auVar20._4_4_ + fVar12;
            fVar13 = local_13c0._8_4_;
            fVar122 = auVar20._8_4_ + fVar13;
            fVar14 = local_13c0._12_4_;
            fVar124 = auVar20._12_4_ + fVar14;
            fVar15 = local_13c0._16_4_;
            fVar126 = auVar20._16_4_ + fVar15;
            fVar16 = local_13c0._20_4_;
            fVar128 = auVar20._20_4_ + fVar16;
            fVar17 = local_13c0._24_4_;
            fVar130 = auVar20._24_4_ + fVar17;
            fVar77 = local_13c0._28_4_;
            fVar209 = local_fe0._0_4_;
            fVar139 = fVar209 + auVar21._0_4_;
            fVar211 = local_fe0._4_4_;
            fVar144 = fVar211 + auVar21._4_4_;
            fVar212 = local_fe0._8_4_;
            fVar147 = fVar212 + auVar21._8_4_;
            fVar213 = local_fe0._12_4_;
            fVar150 = fVar213 + auVar21._12_4_;
            fVar214 = local_fe0._16_4_;
            fVar153 = fVar214 + auVar21._16_4_;
            fVar215 = local_fe0._20_4_;
            fVar156 = fVar215 + auVar21._20_4_;
            fVar216 = local_fe0._24_4_;
            fVar159 = fVar216 + auVar21._24_4_;
            fVar169 = local_fe0._28_4_;
            fVar66 = local_1040._0_4_;
            fVar71 = local_1040._4_4_;
            auVar22._4_4_ = fVar71 * fVar120;
            auVar22._0_4_ = fVar66 * fVar114;
            fVar72 = local_1040._8_4_;
            auVar22._8_4_ = fVar72 * fVar122;
            fVar73 = local_1040._12_4_;
            auVar22._12_4_ = fVar73 * fVar124;
            fVar74 = local_1040._16_4_;
            auVar22._16_4_ = fVar74 * fVar126;
            fVar75 = local_1040._20_4_;
            auVar22._20_4_ = fVar75 * fVar128;
            fVar76 = local_1040._24_4_;
            auVar22._24_4_ = fVar76 * fVar130;
            auVar22._28_4_ = auVar98._12_4_;
            fVar188 = local_1020._0_4_;
            fVar193 = local_1020._4_4_;
            auVar23._4_4_ = fVar193 * fVar144;
            auVar23._0_4_ = fVar188 * fVar139;
            fVar195 = local_1020._8_4_;
            auVar23._8_4_ = fVar195 * fVar147;
            fVar197 = local_1020._12_4_;
            auVar23._12_4_ = fVar197 * fVar150;
            fVar199 = local_1020._16_4_;
            auVar23._16_4_ = fVar199 * fVar153;
            fVar201 = local_1020._20_4_;
            auVar23._20_4_ = fVar201 * fVar156;
            fVar203 = local_1020._24_4_;
            auVar23._24_4_ = fVar203 * fVar159;
            auVar23._28_4_ = auVar89._12_4_;
            auVar22 = vsubps_avx(auVar23,auVar22);
            fVar180 = local_13e0._0_4_;
            fVar162 = fVar180 + auVar19._0_4_;
            fVar182 = local_13e0._4_4_;
            fVar166 = fVar182 + auVar19._4_4_;
            fVar183 = local_13e0._8_4_;
            fVar168 = fVar183 + auVar19._8_4_;
            fVar184 = local_13e0._12_4_;
            fVar170 = fVar184 + auVar19._12_4_;
            fVar185 = local_13e0._16_4_;
            fVar172 = fVar185 + auVar19._16_4_;
            fVar186 = local_13e0._20_4_;
            fVar174 = fVar186 + auVar19._20_4_;
            fVar187 = local_13e0._24_4_;
            fVar176 = fVar187 + auVar19._24_4_;
            fVar84 = local_1000._0_4_;
            fVar85 = local_1000._4_4_;
            auVar24._4_4_ = fVar144 * fVar85;
            auVar24._0_4_ = fVar139 * fVar84;
            fVar139 = local_1000._8_4_;
            auVar24._8_4_ = fVar147 * fVar139;
            fVar144 = local_1000._12_4_;
            auVar24._12_4_ = fVar150 * fVar144;
            fVar147 = local_1000._16_4_;
            auVar24._16_4_ = fVar153 * fVar147;
            fVar150 = local_1000._20_4_;
            auVar24._20_4_ = fVar156 * fVar150;
            fVar153 = local_1000._24_4_;
            auVar24._24_4_ = fVar159 * fVar153;
            auVar24._28_4_ = fVar169 + auVar21._28_4_;
            auVar81 = local_1040;
            auVar25._4_4_ = fVar166 * fVar71;
            auVar25._0_4_ = fVar162 * fVar66;
            auVar25._8_4_ = fVar168 * fVar72;
            auVar25._12_4_ = fVar170 * fVar73;
            auVar25._16_4_ = fVar172 * fVar74;
            auVar25._20_4_ = fVar174 * fVar75;
            auVar25._24_4_ = fVar176 * fVar76;
            auVar25._28_4_ = auVar89._12_4_;
            auVar23 = vsubps_avx(auVar25,auVar24);
            auVar26._4_4_ = fVar193 * fVar166;
            auVar26._0_4_ = fVar188 * fVar162;
            auVar26._8_4_ = fVar195 * fVar168;
            auVar26._12_4_ = fVar197 * fVar170;
            auVar26._16_4_ = fVar199 * fVar172;
            auVar26._20_4_ = fVar201 * fVar174;
            auVar26._24_4_ = fVar203 * fVar176;
            auVar26._28_4_ = local_13e0._28_4_ + auVar19._28_4_;
            auVar27._4_4_ = fVar85 * fVar120;
            auVar27._0_4_ = fVar84 * fVar114;
            auVar27._8_4_ = fVar139 * fVar122;
            auVar27._12_4_ = fVar144 * fVar124;
            auVar27._16_4_ = fVar147 * fVar126;
            auVar27._20_4_ = fVar150 * fVar128;
            auVar27._24_4_ = fVar153 * fVar130;
            auVar27._28_4_ = auVar20._28_4_ + fVar77;
            auVar24 = vsubps_avx(auVar27,auVar26);
            local_14c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_1500._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_14e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1080._0_4_ =
                 (float)local_14e0._4_4_ * auVar22._0_4_ +
                 (float)local_14c0._4_4_ * auVar23._0_4_ + local_1500._4_4_ * auVar24._0_4_;
            local_1080._4_4_ =
                 (float)local_14e0._4_4_ * auVar22._4_4_ +
                 (float)local_14c0._4_4_ * auVar23._4_4_ + local_1500._4_4_ * auVar24._4_4_;
            local_1080._8_4_ =
                 (float)local_14e0._4_4_ * auVar22._8_4_ +
                 (float)local_14c0._4_4_ * auVar23._8_4_ + local_1500._4_4_ * auVar24._8_4_;
            local_1080._12_4_ =
                 (float)local_14e0._4_4_ * auVar22._12_4_ +
                 (float)local_14c0._4_4_ * auVar23._12_4_ + local_1500._4_4_ * auVar24._12_4_;
            local_1080._16_4_ =
                 (float)local_14e0._4_4_ * auVar22._16_4_ +
                 (float)local_14c0._4_4_ * auVar23._16_4_ + local_1500._4_4_ * auVar24._16_4_;
            local_1080._20_4_ =
                 (float)local_14e0._4_4_ * auVar22._20_4_ +
                 (float)local_14c0._4_4_ * auVar23._20_4_ + local_1500._4_4_ * auVar24._20_4_;
            local_1080._24_4_ =
                 (float)local_14e0._4_4_ * auVar22._24_4_ +
                 (float)local_14c0._4_4_ * auVar23._24_4_ + local_1500._4_4_ * auVar24._24_4_;
            local_1080._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar24._28_4_;
            auVar22 = vsubps_avx(local_13c0,auVar99);
            local_1060 = vsubps_avx(local_fe0,auVar18);
            fVar166 = fVar11 + auVar99._0_4_;
            fVar168 = fVar12 + auVar99._4_4_;
            fVar170 = fVar13 + auVar99._8_4_;
            fVar172 = fVar14 + auVar99._12_4_;
            fVar174 = fVar15 + auVar99._16_4_;
            fVar176 = fVar16 + auVar99._20_4_;
            fVar131 = fVar17 + auVar99._24_4_;
            fVar114 = auVar99._28_4_;
            fVar124 = fVar209 + auVar18._0_4_;
            fVar126 = fVar211 + auVar18._4_4_;
            fVar128 = fVar212 + auVar18._8_4_;
            fVar130 = fVar213 + auVar18._12_4_;
            fVar156 = fVar214 + auVar18._16_4_;
            fVar159 = fVar215 + auVar18._20_4_;
            fVar162 = fVar216 + auVar18._24_4_;
            fVar189 = local_1060._0_4_;
            fVar194 = local_1060._4_4_;
            auVar28._4_4_ = fVar194 * fVar168;
            auVar28._0_4_ = fVar189 * fVar166;
            fVar196 = local_1060._8_4_;
            auVar28._8_4_ = fVar196 * fVar170;
            fVar198 = local_1060._12_4_;
            auVar28._12_4_ = fVar198 * fVar172;
            fVar200 = local_1060._16_4_;
            auVar28._16_4_ = fVar200 * fVar174;
            fVar202 = local_1060._20_4_;
            auVar28._20_4_ = fVar202 * fVar176;
            fVar204 = local_1060._24_4_;
            auVar28._24_4_ = fVar204 * fVar131;
            auVar28._28_4_ = fVar169;
            fVar140 = auVar22._0_4_;
            fVar145 = auVar22._4_4_;
            auVar29._4_4_ = fVar145 * fVar126;
            auVar29._0_4_ = fVar140 * fVar124;
            fVar148 = auVar22._8_4_;
            auVar29._8_4_ = fVar148 * fVar128;
            fVar151 = auVar22._12_4_;
            auVar29._12_4_ = fVar151 * fVar130;
            fVar154 = auVar22._16_4_;
            auVar29._16_4_ = fVar154 * fVar156;
            fVar157 = auVar22._20_4_;
            auVar29._20_4_ = fVar157 * fVar159;
            fVar160 = auVar22._24_4_;
            auVar29._24_4_ = fVar160 * fVar162;
            auVar29._28_4_ = fVar77;
            auVar22 = vsubps_avx(auVar29,auVar28);
            auVar23 = vsubps_avx(local_13e0,auVar80);
            fVar120 = auVar23._0_4_;
            fVar122 = auVar23._4_4_;
            auVar30._4_4_ = fVar122 * fVar126;
            auVar30._0_4_ = fVar120 * fVar124;
            fVar124 = auVar23._8_4_;
            auVar30._8_4_ = fVar124 * fVar128;
            fVar126 = auVar23._12_4_;
            auVar30._12_4_ = fVar126 * fVar130;
            fVar128 = auVar23._16_4_;
            auVar30._16_4_ = fVar128 * fVar156;
            fVar130 = auVar23._20_4_;
            auVar30._20_4_ = fVar130 * fVar159;
            fVar156 = auVar23._24_4_;
            auVar30._24_4_ = fVar156 * fVar162;
            auVar30._28_4_ = fVar169 + auVar18._28_4_;
            fVar159 = fVar180 + auVar80._0_4_;
            fVar162 = fVar182 + auVar80._4_4_;
            fVar169 = fVar183 + auVar80._8_4_;
            fVar171 = fVar184 + auVar80._12_4_;
            fVar173 = fVar185 + auVar80._16_4_;
            fVar175 = fVar186 + auVar80._20_4_;
            fVar177 = fVar187 + auVar80._24_4_;
            auVar31._4_4_ = fVar194 * fVar162;
            auVar31._0_4_ = fVar189 * fVar159;
            auVar31._8_4_ = fVar196 * fVar169;
            auVar31._12_4_ = fVar198 * fVar171;
            auVar31._16_4_ = fVar200 * fVar173;
            auVar31._20_4_ = fVar202 * fVar175;
            auVar31._24_4_ = fVar204 * fVar177;
            auVar31._28_4_ = local_1060._28_4_;
            auVar23 = vsubps_avx(auVar31,auVar30);
            auVar32._4_4_ = fVar145 * fVar162;
            auVar32._0_4_ = fVar140 * fVar159;
            auVar32._8_4_ = fVar148 * fVar169;
            auVar32._12_4_ = fVar151 * fVar171;
            auVar32._16_4_ = fVar154 * fVar173;
            auVar32._20_4_ = fVar157 * fVar175;
            auVar32._24_4_ = fVar160 * fVar177;
            auVar32._28_4_ = local_13e0._28_4_ + auVar80._28_4_;
            auVar33._4_4_ = fVar122 * fVar168;
            auVar33._0_4_ = fVar120 * fVar166;
            auVar33._8_4_ = fVar124 * fVar170;
            auVar33._12_4_ = fVar126 * fVar172;
            auVar33._16_4_ = fVar128 * fVar174;
            auVar33._20_4_ = fVar130 * fVar176;
            auVar33._24_4_ = fVar156 * fVar131;
            auVar33._28_4_ = fVar77 + fVar114;
            auVar24 = vsubps_avx(auVar33,auVar32);
            local_10c0._0_4_ =
                 (float)local_14e0._4_4_ * auVar22._0_4_ +
                 (float)local_14c0._4_4_ * auVar23._0_4_ + local_1500._4_4_ * auVar24._0_4_;
            local_10c0._4_4_ =
                 (float)local_14e0._4_4_ * auVar22._4_4_ +
                 (float)local_14c0._4_4_ * auVar23._4_4_ + local_1500._4_4_ * auVar24._4_4_;
            local_10c0._8_4_ =
                 (float)local_14e0._4_4_ * auVar22._8_4_ +
                 (float)local_14c0._4_4_ * auVar23._8_4_ + local_1500._4_4_ * auVar24._8_4_;
            local_10c0._12_4_ =
                 (float)local_14e0._4_4_ * auVar22._12_4_ +
                 (float)local_14c0._4_4_ * auVar23._12_4_ + local_1500._4_4_ * auVar24._12_4_;
            local_10c0._16_4_ =
                 (float)local_14e0._4_4_ * auVar22._16_4_ +
                 (float)local_14c0._4_4_ * auVar23._16_4_ + local_1500._4_4_ * auVar24._16_4_;
            local_10c0._20_4_ =
                 (float)local_14e0._4_4_ * auVar22._20_4_ +
                 (float)local_14c0._4_4_ * auVar23._20_4_ + local_1500._4_4_ * auVar24._20_4_;
            local_10c0._24_4_ =
                 (float)local_14e0._4_4_ * auVar22._24_4_ +
                 (float)local_14c0._4_4_ * auVar23._24_4_ + local_1500._4_4_ * auVar24._24_4_;
            local_10c0._28_4_ = auVar22._28_4_ + auVar23._28_4_ + auVar24._28_4_;
            auVar23 = vsubps_avx(auVar80,auVar19);
            fVar77 = auVar80._0_4_ + auVar19._0_4_;
            fVar159 = auVar80._4_4_ + auVar19._4_4_;
            fVar162 = auVar80._8_4_ + auVar19._8_4_;
            fVar166 = auVar80._12_4_ + auVar19._12_4_;
            fVar168 = auVar80._16_4_ + auVar19._16_4_;
            fVar170 = auVar80._20_4_ + auVar19._20_4_;
            fVar172 = auVar80._24_4_ + auVar19._24_4_;
            auVar24 = vsubps_avx(auVar99,auVar20);
            fVar174 = auVar99._0_4_ + auVar20._0_4_;
            fVar176 = auVar99._4_4_ + auVar20._4_4_;
            fVar131 = auVar99._8_4_ + auVar20._8_4_;
            fVar169 = auVar99._12_4_ + auVar20._12_4_;
            fVar171 = auVar99._16_4_ + auVar20._16_4_;
            fVar173 = auVar99._20_4_ + auVar20._20_4_;
            fVar175 = auVar99._24_4_ + auVar20._24_4_;
            fVar177 = fVar114 + auVar20._28_4_;
            auVar99 = vsubps_avx(auVar18,auVar21);
            fVar93 = auVar18._0_4_ + auVar21._0_4_;
            fVar105 = auVar18._4_4_ + auVar21._4_4_;
            fVar106 = auVar18._8_4_ + auVar21._8_4_;
            fVar107 = auVar18._12_4_ + auVar21._12_4_;
            fVar108 = auVar18._16_4_ + auVar21._16_4_;
            fVar109 = auVar18._20_4_ + auVar21._20_4_;
            fVar110 = auVar18._24_4_ + auVar21._24_4_;
            fVar115 = auVar99._0_4_;
            fVar121 = auVar99._4_4_;
            auVar20._4_4_ = fVar121 * fVar176;
            auVar20._0_4_ = fVar115 * fVar174;
            fVar123 = auVar99._8_4_;
            auVar20._8_4_ = fVar123 * fVar131;
            fVar125 = auVar99._12_4_;
            auVar20._12_4_ = fVar125 * fVar169;
            fVar127 = auVar99._16_4_;
            auVar20._16_4_ = fVar127 * fVar171;
            fVar129 = auVar99._20_4_;
            auVar20._20_4_ = fVar129 * fVar173;
            fVar132 = auVar99._24_4_;
            auVar20._24_4_ = fVar132 * fVar175;
            auVar20._28_4_ = auVar22._28_4_;
            fVar141 = auVar24._0_4_;
            fVar146 = auVar24._4_4_;
            auVar34._4_4_ = fVar146 * fVar105;
            auVar34._0_4_ = fVar141 * fVar93;
            fVar149 = auVar24._8_4_;
            auVar34._8_4_ = fVar149 * fVar106;
            fVar152 = auVar24._12_4_;
            auVar34._12_4_ = fVar152 * fVar107;
            fVar155 = auVar24._16_4_;
            auVar34._16_4_ = fVar155 * fVar108;
            fVar158 = auVar24._20_4_;
            auVar34._20_4_ = fVar158 * fVar109;
            fVar161 = auVar24._24_4_;
            auVar34._24_4_ = fVar161 * fVar110;
            auVar34._28_4_ = fVar114;
            auVar99 = vsubps_avx(auVar34,auVar20);
            fVar163 = auVar23._0_4_;
            fVar167 = auVar23._4_4_;
            auVar35._4_4_ = fVar167 * fVar105;
            auVar35._0_4_ = fVar163 * fVar93;
            fVar93 = auVar23._8_4_;
            auVar35._8_4_ = fVar93 * fVar106;
            fVar105 = auVar23._12_4_;
            auVar35._12_4_ = fVar105 * fVar107;
            fVar106 = auVar23._16_4_;
            auVar35._16_4_ = fVar106 * fVar108;
            fVar107 = auVar23._20_4_;
            auVar35._20_4_ = fVar107 * fVar109;
            fVar108 = auVar23._24_4_;
            auVar35._24_4_ = fVar108 * fVar110;
            auVar35._28_4_ = auVar18._28_4_ + auVar21._28_4_;
            auVar18._4_4_ = fVar121 * fVar159;
            auVar18._0_4_ = fVar115 * fVar77;
            auVar18._8_4_ = fVar123 * fVar162;
            auVar18._12_4_ = fVar125 * fVar166;
            auVar18._16_4_ = fVar127 * fVar168;
            auVar18._20_4_ = fVar129 * fVar170;
            auVar18._24_4_ = fVar132 * fVar172;
            auVar18._28_4_ = fVar114;
            auVar18 = vsubps_avx(auVar18,auVar35);
            auVar21._4_4_ = fVar146 * fVar159;
            auVar21._0_4_ = fVar141 * fVar77;
            auVar21._8_4_ = fVar149 * fVar162;
            auVar21._12_4_ = fVar152 * fVar166;
            auVar21._16_4_ = fVar155 * fVar168;
            auVar21._20_4_ = fVar158 * fVar170;
            auVar21._24_4_ = fVar161 * fVar172;
            auVar21._28_4_ = auVar80._28_4_ + auVar19._28_4_;
            auVar19._4_4_ = fVar167 * fVar176;
            auVar19._0_4_ = fVar163 * fVar174;
            auVar19._8_4_ = fVar93 * fVar131;
            auVar19._12_4_ = fVar105 * fVar169;
            auVar19._16_4_ = fVar106 * fVar171;
            auVar19._20_4_ = fVar107 * fVar173;
            auVar19._24_4_ = fVar108 * fVar175;
            auVar19._28_4_ = fVar177;
            auVar80 = vsubps_avx(auVar19,auVar21);
            local_1500._0_4_ = (uint)local_1500._4_4_;
            fStack_14f8 = local_1500._4_4_;
            fStack_14f4 = local_1500._4_4_;
            fStack_14f0 = local_1500._4_4_;
            fStack_14ec = local_1500._4_4_;
            fStack_14e8 = local_1500._4_4_;
            fStack_14e4 = local_1500._4_4_;
            local_14c0._0_4_ = local_14c0._4_4_;
            fStack_14b8 = (float)local_14c0._4_4_;
            fStack_14b4 = (float)local_14c0._4_4_;
            fStack_14b0 = (float)local_14c0._4_4_;
            fStack_14ac = (float)local_14c0._4_4_;
            fStack_14a8 = (float)local_14c0._4_4_;
            fStack_14a4 = (float)local_14c0._4_4_;
            local_14e0._0_4_ = local_14e0._4_4_;
            fStack_14d8 = (float)local_14e0._4_4_;
            fStack_14d4 = (float)local_14e0._4_4_;
            fStack_14d0 = (float)local_14e0._4_4_;
            fStack_14cc = (float)local_14e0._4_4_;
            fStack_14c8 = (float)local_14e0._4_4_;
            fStack_14c4 = (float)local_14e0._4_4_;
            auVar82._0_4_ =
                 (float)local_14e0._4_4_ * auVar99._0_4_ +
                 (float)local_14c0._4_4_ * auVar18._0_4_ + local_1500._4_4_ * auVar80._0_4_;
            auVar82._4_4_ =
                 (float)local_14e0._4_4_ * auVar99._4_4_ +
                 (float)local_14c0._4_4_ * auVar18._4_4_ + local_1500._4_4_ * auVar80._4_4_;
            auVar82._8_4_ =
                 (float)local_14e0._4_4_ * auVar99._8_4_ +
                 (float)local_14c0._4_4_ * auVar18._8_4_ + local_1500._4_4_ * auVar80._8_4_;
            auVar82._12_4_ =
                 (float)local_14e0._4_4_ * auVar99._12_4_ +
                 (float)local_14c0._4_4_ * auVar18._12_4_ + local_1500._4_4_ * auVar80._12_4_;
            auVar82._16_4_ =
                 (float)local_14e0._4_4_ * auVar99._16_4_ +
                 (float)local_14c0._4_4_ * auVar18._16_4_ + local_1500._4_4_ * auVar80._16_4_;
            auVar82._20_4_ =
                 (float)local_14e0._4_4_ * auVar99._20_4_ +
                 (float)local_14c0._4_4_ * auVar18._20_4_ + local_1500._4_4_ * auVar80._20_4_;
            auVar82._24_4_ =
                 (float)local_14e0._4_4_ * auVar99._24_4_ +
                 (float)local_14c0._4_4_ * auVar18._24_4_ + local_1500._4_4_ * auVar80._24_4_;
            auVar82._28_4_ = fVar177 + fVar177 + auVar80._28_4_;
            local_10e0._0_4_ = auVar82._0_4_ + local_1080._0_4_ + local_10c0._0_4_;
            local_10e0._4_4_ = auVar82._4_4_ + local_1080._4_4_ + local_10c0._4_4_;
            local_10e0._8_4_ = auVar82._8_4_ + local_1080._8_4_ + local_10c0._8_4_;
            local_10e0._12_4_ = auVar82._12_4_ + local_1080._12_4_ + local_10c0._12_4_;
            local_10e0._16_4_ = auVar82._16_4_ + local_1080._16_4_ + local_10c0._16_4_;
            local_10e0._20_4_ = auVar82._20_4_ + local_1080._20_4_ + local_10c0._20_4_;
            local_10e0._24_4_ = auVar82._24_4_ + local_1080._24_4_ + local_10c0._24_4_;
            local_10e0._28_4_ = auVar82._28_4_ + local_1080._28_4_ + local_10c0._28_4_;
            auVar80 = vminps_avx(local_1080,local_10c0);
            auVar80 = vminps_avx(auVar80,auVar82);
            auVar101._8_4_ = 0x7fffffff;
            auVar101._0_8_ = 0x7fffffff7fffffff;
            auVar101._12_4_ = 0x7fffffff;
            auVar101._16_4_ = 0x7fffffff;
            auVar101._20_4_ = 0x7fffffff;
            auVar101._24_4_ = 0x7fffffff;
            auVar101._28_4_ = 0x7fffffff;
            local_10a0 = vandps_avx(local_10e0,auVar101);
            fVar77 = local_10a0._0_4_ * 1.1920929e-07;
            fVar114 = local_10a0._4_4_ * 1.1920929e-07;
            auVar36._4_4_ = fVar114;
            auVar36._0_4_ = fVar77;
            fVar159 = local_10a0._8_4_ * 1.1920929e-07;
            auVar36._8_4_ = fVar159;
            fVar162 = local_10a0._12_4_ * 1.1920929e-07;
            auVar36._12_4_ = fVar162;
            fVar166 = local_10a0._16_4_ * 1.1920929e-07;
            auVar36._16_4_ = fVar166;
            fVar168 = local_10a0._20_4_ * 1.1920929e-07;
            auVar36._20_4_ = fVar168;
            fVar170 = local_10a0._24_4_ * 1.1920929e-07;
            auVar36._24_4_ = fVar170;
            auVar36._28_4_ = 0x34000000;
            auVar112._0_8_ = CONCAT44(fVar114,fVar77) ^ 0x8000000080000000;
            auVar112._8_4_ = -fVar159;
            auVar112._12_4_ = -fVar162;
            auVar112._16_4_ = -fVar166;
            auVar112._20_4_ = -fVar168;
            auVar112._24_4_ = -fVar170;
            auVar112._28_4_ = 0xb4000000;
            auVar80 = vcmpps_avx(auVar80,auVar112,5);
            auVar18 = vmaxps_avx(local_1080,local_10c0);
            auVar99 = vmaxps_avx(auVar18,auVar82);
            auVar99 = vcmpps_avx(auVar99,auVar36,2);
            auVar99 = vorps_avx(auVar80,auVar99);
            if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar99 >> 0x7f,0) != '\0') ||
                  (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar99 >> 0xbf,0) != '\0') ||
                (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar99[0x1f] < '\0') {
              auVar37._4_4_ = fVar145 * fVar71;
              auVar37._0_4_ = fVar140 * fVar66;
              auVar37._8_4_ = fVar148 * fVar72;
              auVar37._12_4_ = fVar151 * fVar73;
              auVar37._16_4_ = fVar154 * fVar74;
              auVar37._20_4_ = fVar157 * fVar75;
              auVar37._24_4_ = fVar160 * fVar76;
              auVar37._28_4_ = auVar80._28_4_;
              auVar38._4_4_ = fVar193 * fVar194;
              auVar38._0_4_ = fVar188 * fVar189;
              auVar38._8_4_ = fVar195 * fVar196;
              auVar38._12_4_ = fVar197 * fVar198;
              auVar38._16_4_ = fVar199 * fVar200;
              auVar38._20_4_ = fVar201 * fVar202;
              auVar38._24_4_ = fVar203 * fVar204;
              auVar38._28_4_ = 0x34000000;
              auVar19 = vsubps_avx(auVar38,auVar37);
              auVar39._4_4_ = fVar146 * fVar194;
              auVar39._0_4_ = fVar141 * fVar189;
              auVar39._8_4_ = fVar149 * fVar196;
              auVar39._12_4_ = fVar152 * fVar198;
              auVar39._16_4_ = fVar155 * fVar200;
              auVar39._20_4_ = fVar158 * fVar202;
              auVar39._24_4_ = fVar161 * fVar204;
              auVar39._28_4_ = auVar18._28_4_;
              auVar40._4_4_ = fVar145 * fVar121;
              auVar40._0_4_ = fVar140 * fVar115;
              auVar40._8_4_ = fVar148 * fVar123;
              auVar40._12_4_ = fVar151 * fVar125;
              auVar40._16_4_ = fVar154 * fVar127;
              auVar40._20_4_ = fVar157 * fVar129;
              auVar40._24_4_ = fVar160 * fVar132;
              auVar40._28_4_ = auVar23._28_4_;
              auVar20 = vsubps_avx(auVar40,auVar39);
              auVar191._8_4_ = 0x7fffffff;
              auVar191._0_8_ = 0x7fffffff7fffffff;
              auVar191._12_4_ = 0x7fffffff;
              auVar191._16_4_ = 0x7fffffff;
              auVar191._20_4_ = 0x7fffffff;
              auVar191._24_4_ = 0x7fffffff;
              auVar191._28_4_ = 0x7fffffff;
              auVar80 = vandps_avx(auVar191,auVar37);
              auVar18 = vandps_avx(auVar191,auVar39);
              auVar80 = vcmpps_avx(auVar80,auVar18,1);
              local_1280 = vblendvps_avx(auVar20,auVar19,auVar80);
              auVar41._4_4_ = fVar122 * fVar121;
              auVar41._0_4_ = fVar120 * fVar115;
              auVar41._8_4_ = fVar124 * fVar123;
              auVar41._12_4_ = fVar126 * fVar125;
              auVar41._16_4_ = fVar128 * fVar127;
              auVar41._20_4_ = fVar130 * fVar129;
              auVar41._24_4_ = fVar156 * fVar132;
              auVar41._28_4_ = auVar80._28_4_;
              auVar42._4_4_ = fVar122 * fVar71;
              auVar42._0_4_ = fVar120 * fVar66;
              auVar42._8_4_ = fVar124 * fVar72;
              auVar42._12_4_ = fVar126 * fVar73;
              auVar42._16_4_ = fVar128 * fVar74;
              auVar42._20_4_ = fVar130 * fVar75;
              auVar42._24_4_ = fVar156 * fVar76;
              auVar42._28_4_ = auVar19._28_4_;
              auVar43._4_4_ = fVar85 * fVar194;
              auVar43._0_4_ = fVar84 * fVar189;
              auVar43._8_4_ = fVar139 * fVar196;
              auVar43._12_4_ = fVar144 * fVar198;
              auVar43._16_4_ = fVar147 * fVar200;
              auVar43._20_4_ = fVar150 * fVar202;
              auVar43._24_4_ = fVar153 * fVar204;
              auVar43._28_4_ = auVar18._28_4_;
              auVar19 = vsubps_avx(auVar42,auVar43);
              auVar44._4_4_ = fVar194 * fVar167;
              auVar44._0_4_ = fVar189 * fVar163;
              auVar44._8_4_ = fVar196 * fVar93;
              auVar44._12_4_ = fVar198 * fVar105;
              auVar44._16_4_ = fVar200 * fVar106;
              auVar44._20_4_ = fVar202 * fVar107;
              auVar44._24_4_ = fVar204 * fVar108;
              auVar44._28_4_ = local_1060._28_4_;
              auVar20 = vsubps_avx(auVar44,auVar41);
              auVar80 = vandps_avx(auVar191,auVar43);
              auVar18 = vandps_avx(auVar191,auVar41);
              auVar18 = vcmpps_avx(auVar80,auVar18,1);
              local_1260 = vblendvps_avx(auVar20,auVar19,auVar18);
              auVar45._4_4_ = fVar145 * fVar167;
              auVar45._0_4_ = fVar140 * fVar163;
              auVar45._8_4_ = fVar148 * fVar93;
              auVar45._12_4_ = fVar151 * fVar105;
              auVar45._16_4_ = fVar154 * fVar106;
              auVar45._20_4_ = fVar157 * fVar107;
              auVar45._24_4_ = fVar160 * fVar108;
              auVar45._28_4_ = auVar18._28_4_;
              auVar46._4_4_ = fVar85 * fVar145;
              auVar46._0_4_ = fVar84 * fVar140;
              auVar46._8_4_ = fVar139 * fVar148;
              auVar46._12_4_ = fVar144 * fVar151;
              auVar46._16_4_ = fVar147 * fVar154;
              auVar46._20_4_ = fVar150 * fVar157;
              auVar46._24_4_ = fVar153 * fVar160;
              auVar46._28_4_ = auVar19._28_4_;
              auVar47._4_4_ = fVar193 * fVar122;
              auVar47._0_4_ = fVar188 * fVar120;
              auVar47._8_4_ = fVar195 * fVar124;
              auVar47._12_4_ = fVar197 * fVar126;
              auVar47._16_4_ = fVar199 * fVar128;
              auVar47._20_4_ = fVar201 * fVar130;
              auVar47._24_4_ = fVar203 * fVar156;
              auVar47._28_4_ = auVar80._28_4_;
              auVar48._4_4_ = fVar122 * fVar146;
              auVar48._0_4_ = fVar120 * fVar141;
              auVar48._8_4_ = fVar124 * fVar149;
              auVar48._12_4_ = fVar126 * fVar152;
              auVar48._16_4_ = fVar128 * fVar155;
              auVar48._20_4_ = fVar130 * fVar158;
              auVar48._24_4_ = fVar156 * fVar161;
              auVar48._28_4_ = local_1040._28_4_;
              auVar19 = vsubps_avx(auVar46,auVar47);
              auVar20 = vsubps_avx(auVar48,auVar45);
              auVar80 = vandps_avx(auVar47,auVar191);
              auVar18 = vandps_avx(auVar45,auVar191);
              auVar80 = vcmpps_avx(auVar80,auVar18,1);
              local_1240 = vblendvps_avx(auVar20,auVar19,auVar80);
              auVar67 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              fVar153 = local_1240._0_4_;
              fVar66 = local_1240._4_4_;
              fVar120 = local_1240._8_4_;
              fVar71 = local_1240._12_4_;
              fVar122 = local_1240._16_4_;
              fVar72 = local_1240._20_4_;
              fVar124 = local_1240._24_4_;
              fVar156 = local_1260._0_4_;
              fVar159 = local_1260._4_4_;
              fVar162 = local_1260._8_4_;
              fVar166 = local_1260._12_4_;
              fVar168 = local_1260._16_4_;
              fVar170 = local_1260._20_4_;
              fVar172 = local_1260._24_4_;
              fVar73 = local_1280._0_4_;
              fVar126 = local_1280._4_4_;
              fVar74 = local_1280._8_4_;
              fVar128 = local_1280._12_4_;
              fVar75 = local_1280._16_4_;
              fVar130 = local_1280._20_4_;
              fVar76 = local_1280._24_4_;
              fVar77 = fVar73 * (float)local_14e0._4_4_ +
                       fVar156 * (float)local_14c0._4_4_ + fVar153 * local_1500._4_4_;
              fVar114 = fVar126 * (float)local_14e0._4_4_ +
                        fVar159 * (float)local_14c0._4_4_ + fVar66 * local_1500._4_4_;
              fVar84 = fVar74 * (float)local_14e0._4_4_ +
                       fVar162 * (float)local_14c0._4_4_ + fVar120 * local_1500._4_4_;
              fVar85 = fVar128 * (float)local_14e0._4_4_ +
                       fVar166 * (float)local_14c0._4_4_ + fVar71 * local_1500._4_4_;
              fVar139 = fVar75 * (float)local_14e0._4_4_ +
                        fVar168 * (float)local_14c0._4_4_ + fVar122 * local_1500._4_4_;
              fVar144 = fVar130 * (float)local_14e0._4_4_ +
                        fVar170 * (float)local_14c0._4_4_ + fVar72 * local_1500._4_4_;
              fVar147 = fVar76 * (float)local_14e0._4_4_ +
                        fVar172 * (float)local_14c0._4_4_ + fVar124 * local_1500._4_4_;
              fVar150 = auVar80._28_4_ + auVar80._28_4_ + auVar23._28_4_;
              auVar83._0_4_ = fVar77 + fVar77;
              auVar83._4_4_ = fVar114 + fVar114;
              auVar83._8_4_ = fVar84 + fVar84;
              auVar83._12_4_ = fVar85 + fVar85;
              auVar83._16_4_ = fVar139 + fVar139;
              auVar83._20_4_ = fVar144 + fVar144;
              auVar83._24_4_ = fVar147 + fVar147;
              auVar83._28_4_ = fVar150 + fVar150;
              auVar80 = vrcpps_avx(auVar83);
              fVar77 = fVar73 * fVar180 + fVar156 * fVar11 + fVar153 * fVar209;
              fVar114 = fVar126 * fVar182 + fVar159 * fVar12 + fVar66 * fVar211;
              fVar84 = fVar74 * fVar183 + fVar162 * fVar13 + fVar120 * fVar212;
              fVar85 = fVar128 * fVar184 + fVar166 * fVar14 + fVar71 * fVar213;
              fVar139 = fVar75 * fVar185 + fVar168 * fVar15 + fVar122 * fVar214;
              fVar144 = fVar130 * fVar186 + fVar170 * fVar16 + fVar72 * fVar215;
              fVar147 = fVar76 * fVar187 + fVar172 * fVar17 + fVar124 * fVar216;
              fVar11 = auVar80._0_4_;
              fVar12 = auVar80._4_4_;
              auVar49._4_4_ = auVar83._4_4_ * fVar12;
              auVar49._0_4_ = auVar83._0_4_ * fVar11;
              fVar13 = auVar80._8_4_;
              auVar49._8_4_ = auVar83._8_4_ * fVar13;
              fVar14 = auVar80._12_4_;
              auVar49._12_4_ = auVar83._12_4_ * fVar14;
              fVar15 = auVar80._16_4_;
              auVar49._16_4_ = auVar83._16_4_ * fVar15;
              fVar16 = auVar80._20_4_;
              auVar49._20_4_ = auVar83._20_4_ * fVar16;
              fVar17 = auVar80._24_4_;
              auVar49._24_4_ = auVar83._24_4_ * fVar17;
              auVar49._28_4_ = auVar19._28_4_;
              auVar134._8_4_ = 0x3f800000;
              auVar134._0_8_ = 0x3f8000003f800000;
              auVar134._12_4_ = 0x3f800000;
              auVar134._16_4_ = 0x3f800000;
              auVar134._20_4_ = 0x3f800000;
              auVar134._24_4_ = 0x3f800000;
              auVar134._28_4_ = 0x3f800000;
              auVar80 = vsubps_avx(auVar134,auVar49);
              uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar113._4_4_ = uVar2;
              auVar113._0_4_ = uVar2;
              auVar113._8_4_ = uVar2;
              auVar113._12_4_ = uVar2;
              auVar113._16_4_ = uVar2;
              auVar113._20_4_ = uVar2;
              auVar113._24_4_ = uVar2;
              auVar113._28_4_ = uVar2;
              local_14c0._4_4_ = (fVar114 + fVar114) * (fVar12 + fVar12 * auVar80._4_4_);
              local_14c0._0_4_ = (fVar77 + fVar77) * (fVar11 + fVar11 * auVar80._0_4_);
              fStack_14b8 = (fVar84 + fVar84) * (fVar13 + fVar13 * auVar80._8_4_);
              fStack_14b4 = (fVar85 + fVar85) * (fVar14 + fVar14 * auVar80._12_4_);
              fStack_14b0 = (fVar139 + fVar139) * (fVar15 + fVar15 * auVar80._16_4_);
              fStack_14ac = (fVar144 + fVar144) * (fVar16 + fVar16 * auVar80._20_4_);
              fStack_14a8 = (fVar147 + fVar147) * (fVar17 + fVar17 * auVar80._24_4_);
              fStack_14a4 = (float)auVar24._28_4_;
              auVar80 = vcmpps_avx(auVar113,_local_14c0,2);
              fVar11 = (ray->super_RayK<1>).tfar;
              auVar102._4_4_ = fVar11;
              auVar102._0_4_ = fVar11;
              auVar102._8_4_ = fVar11;
              auVar102._12_4_ = fVar11;
              auVar102._16_4_ = fVar11;
              auVar102._20_4_ = fVar11;
              auVar102._24_4_ = fVar11;
              auVar102._28_4_ = fVar11;
              auVar99 = vcmpps_avx(_local_14c0,auVar102,2);
              auVar80 = vandps_avx(auVar99,auVar80);
              auVar18 = vcmpps_avx(auVar83,_DAT_01faff00,4);
              auVar80 = vandps_avx(auVar80,auVar18);
              auVar98 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
              auVar67 = vpand_avx(auVar98,auVar67);
              auVar98 = vpmovsxwd_avx(auVar67);
              auVar78 = vpshufd_avx(auVar67,0xee);
              auVar78 = vpmovsxwd_avx(auVar78);
              local_1220._16_16_ = auVar78;
              local_1220._0_16_ = auVar98;
              if ((((((((local_1220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1220 >> 0x7f,0) != '\0') ||
                    (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar78 >> 0x3f,0) != '\0') ||
                  (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar78[0xf] < '\0') {
                local_12e0 = local_1080;
                local_12c0 = local_10c0;
                local_12a0 = local_10e0;
                auVar80 = vrcpps_avx(local_10e0);
                fVar11 = auVar80._0_4_;
                fVar12 = auVar80._4_4_;
                auVar50._4_4_ = local_10e0._4_4_ * fVar12;
                auVar50._0_4_ = local_10e0._0_4_ * fVar11;
                fVar13 = auVar80._8_4_;
                auVar50._8_4_ = local_10e0._8_4_ * fVar13;
                fVar14 = auVar80._12_4_;
                auVar50._12_4_ = local_10e0._12_4_ * fVar14;
                fVar15 = auVar80._16_4_;
                auVar50._16_4_ = local_10e0._16_4_ * fVar15;
                fVar16 = auVar80._20_4_;
                auVar50._20_4_ = local_10e0._20_4_ * fVar16;
                fVar17 = auVar80._24_4_;
                auVar50._24_4_ = local_10e0._24_4_ * fVar17;
                auVar50._28_4_ = auVar99._28_4_;
                auVar137._8_4_ = 0x3f800000;
                auVar137._0_8_ = 0x3f8000003f800000;
                auVar137._12_4_ = 0x3f800000;
                auVar137._16_4_ = 0x3f800000;
                auVar137._20_4_ = 0x3f800000;
                auVar137._24_4_ = 0x3f800000;
                auVar137._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar137,auVar50);
                auVar91._0_4_ = fVar11 + fVar11 * auVar99._0_4_;
                auVar91._4_4_ = fVar12 + fVar12 * auVar99._4_4_;
                auVar91._8_4_ = fVar13 + fVar13 * auVar99._8_4_;
                auVar91._12_4_ = fVar14 + fVar14 * auVar99._12_4_;
                auVar91._16_4_ = fVar15 + fVar15 * auVar99._16_4_;
                auVar91._20_4_ = fVar16 + fVar16 * auVar99._20_4_;
                auVar91._24_4_ = fVar17 + fVar17 * auVar99._24_4_;
                auVar91._28_4_ = auVar80._28_4_ + auVar99._28_4_;
                auVar103._8_4_ = 0x219392ef;
                auVar103._0_8_ = 0x219392ef219392ef;
                auVar103._12_4_ = 0x219392ef;
                auVar103._16_4_ = 0x219392ef;
                auVar103._20_4_ = 0x219392ef;
                auVar103._24_4_ = 0x219392ef;
                auVar103._28_4_ = 0x219392ef;
                auVar99 = vcmpps_avx(local_10a0,auVar103,5);
                auVar80 = vandps_avx(auVar99,auVar91);
                local_11c0 = _local_14c0;
                local_1140 = local_1100;
                auVar51._4_4_ = local_1080._4_4_ * auVar80._4_4_;
                auVar51._0_4_ = local_1080._0_4_ * auVar80._0_4_;
                auVar51._8_4_ = local_1080._8_4_ * auVar80._8_4_;
                auVar51._12_4_ = local_1080._12_4_ * auVar80._12_4_;
                auVar51._16_4_ = local_1080._16_4_ * auVar80._16_4_;
                auVar51._20_4_ = local_1080._20_4_ * auVar80._20_4_;
                auVar51._24_4_ = local_1080._24_4_ * auVar80._24_4_;
                auVar51._28_4_ = auVar99._28_4_;
                auVar99 = vminps_avx(auVar51,auVar137);
                auVar52._4_4_ = local_10c0._4_4_ * auVar80._4_4_;
                auVar52._0_4_ = local_10c0._0_4_ * auVar80._0_4_;
                auVar52._8_4_ = local_10c0._8_4_ * auVar80._8_4_;
                auVar52._12_4_ = local_10c0._12_4_ * auVar80._12_4_;
                auVar52._16_4_ = local_10c0._16_4_ * auVar80._16_4_;
                auVar52._20_4_ = local_10c0._20_4_ * auVar80._20_4_;
                auVar52._24_4_ = local_10c0._24_4_ * auVar80._24_4_;
                auVar52._28_4_ = auVar80._28_4_;
                auVar80 = vminps_avx(auVar52,auVar137);
                auVar18 = vsubps_avx(auVar137,auVar99);
                local_11e0 = vblendvps_avx(auVar80,auVar18,local_1100);
                auVar80 = vsubps_avx(auVar137,auVar80);
                local_1200 = vblendvps_avx(auVar99,auVar80,local_1100);
                local_11a0[0] = fVar73 * (float)local_1120._0_4_;
                local_11a0[1] = fVar126 * (float)local_1120._4_4_;
                local_11a0[2] = fVar74 * fStack_1118;
                local_11a0[3] = fVar128 * fStack_1114;
                fStack_1190 = fVar75 * fStack_1110;
                fStack_118c = fVar130 * fStack_110c;
                fStack_1188 = fVar76 * fStack_1108;
                uStack_1184 = local_1200._28_4_;
                local_1180[0] = fVar156 * (float)local_1120._0_4_;
                local_1180[1] = fVar159 * (float)local_1120._4_4_;
                local_1180[2] = fVar162 * fStack_1118;
                local_1180[3] = fVar166 * fStack_1114;
                fStack_1170 = fVar168 * fStack_1110;
                fStack_116c = fVar170 * fStack_110c;
                fStack_1168 = fVar172 * fStack_1108;
                uStack_1164 = auVar99._28_4_;
                local_1160[0] = (float)local_1120._0_4_ * fVar153;
                local_1160[1] = (float)local_1120._4_4_ * fVar66;
                local_1160[2] = fStack_1118 * fVar120;
                local_1160[3] = fStack_1114 * fVar71;
                fStack_1150 = fStack_1110 * fVar122;
                fStack_114c = fStack_110c * fVar72;
                fStack_1148 = fStack_1108 * fVar124;
                uStack_1144 = uStack_1104;
                auVar98 = vpmovzxwd_avx(auVar67);
                auVar92._0_16_ = vpslld_avx(auVar98,0x1f);
                auVar98 = vpunpckhwd_avx(auVar67,auVar67);
                auVar98 = vpslld_avx(auVar98,0x1f);
                auVar92._16_16_ = auVar98;
                auVar104._8_4_ = 0x7f800000;
                auVar104._0_8_ = 0x7f8000007f800000;
                auVar104._12_4_ = 0x7f800000;
                auVar104._16_4_ = 0x7f800000;
                auVar104._20_4_ = 0x7f800000;
                auVar104._24_4_ = 0x7f800000;
                auVar104._28_4_ = 0x7f800000;
                auVar80 = vblendvps_avx(auVar104,_local_14c0,auVar92);
                auVar99 = vshufps_avx(auVar80,auVar80,0xb1);
                auVar99 = vminps_avx(auVar80,auVar99);
                auVar18 = vshufpd_avx(auVar99,auVar99,5);
                auVar99 = vminps_avx(auVar99,auVar18);
                auVar18 = vperm2f128_avx(auVar99,auVar99,1);
                auVar99 = vminps_avx(auVar99,auVar18);
                auVar80 = vcmpps_avx(auVar80,auVar99,0);
                auVar98 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                auVar67 = vpand_avx(auVar98,auVar67);
                auVar98 = vpmovzxwd_avx(auVar67);
                auVar98 = vpslld_avx(auVar98,0x1f);
                auVar98 = vpsrad_avx(auVar98,0x1f);
                auVar67 = vpunpckhwd_avx(auVar67,auVar67);
                auVar67 = vpslld_avx(auVar67,0x1f);
                auVar67 = vpsrad_avx(auVar67,0x1f);
                auVar68._16_16_ = auVar67;
                auVar68._0_16_ = auVar98;
                _local_14e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                local_1420 = local_1220;
                if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar68 >> 0x7f,0) == '\0') &&
                      (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar67 >> 0x3f,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar67[0xf]) {
                  auVar68 = local_1220;
                }
                uVar60 = vextractps_avx(local_14e0._0_16_,1);
                uVar54 = vmovmskps_avx(auVar68);
                uVar55 = 0;
                local_1040 = auVar81;
                if (uVar54 != 0) {
                  for (; (uVar54 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                  }
                }
                do {
                  uVar58 = CONCAT44(0,uVar55);
                  uVar55 = *(uint *)((long)&local_fc0 + uVar58 * 4);
                  pGVar10 = (local_1460->geometries).items[uVar55].ptr;
                  if ((pGVar10->mask & uVar60) == 0) {
                    *(undefined4 *)(local_1420 + uVar58 * 4) = 0;
                  }
                  else {
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar59 = context->user;
                      if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar11 = *(float *)(local_1200 + uVar58 * 4);
                        fVar12 = *(float *)(local_11e0 + uVar58 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_11c0 + uVar58 * 4);
                        (ray->Ng).field_0.field_0.x = local_11a0[uVar58];
                        (ray->Ng).field_0.field_0.y = local_1180[uVar58];
                        (ray->Ng).field_0.field_0.z = local_1160[uVar58];
                        ray->u = fVar11;
                        ray->v = fVar12;
                        ray->primID = *(uint *)((long)&local_1300 + uVar58 * 4);
                        ray->geomID = uVar55;
                        ray->instID[0] = pRVar59->instID[0];
                        ray->instPrimID[0] = pRVar59->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar59 = context->user;
                    }
                    local_1500 = (byte *)context->args;
                    local_1450 = local_11a0[uVar58];
                    local_144c = local_1180[uVar58];
                    local_1448 = local_1160[uVar58];
                    local_1444 = *(undefined4 *)(local_1200 + uVar58 * 4);
                    local_1440 = *(undefined4 *)(local_11e0 + uVar58 * 4);
                    local_143c = *(undefined4 *)((long)&local_1300 + uVar58 * 4);
                    local_1438 = uVar55;
                    local_1434 = pRVar59->instID[0];
                    local_1430 = pRVar59->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_11c0 + uVar58 * 4);
                    local_1504 = -1;
                    local_1498.valid = &local_1504;
                    local_1498.geometryUserPtr = pGVar10->userPtr;
                    local_1498.context = pRVar59;
                    local_1498.ray = (RTCRayN *)ray;
                    local_1498.hit = (RTCHitN *)&local_1450;
                    local_1498.N = 1;
                    local_13c0._0_8_ = pGVar10;
                    local_13e0._0_8_ = uVar58;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011e28ca:
                      if ((*(code **)(local_1500 + 0x10) != (code *)0x0) &&
                         (((*local_1500 & 2) != 0 ||
                          ((*(byte *)(local_13c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (**(code **)(local_1500 + 0x10))(&local_1498);
                        uVar58 = local_13e0._0_8_;
                        if (*local_1498.valid == 0) goto LAB_011e298a;
                      }
                      (((Vec3f *)((long)local_1498.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1498.hit;
                      (((Vec3f *)((long)local_1498.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1498.hit + 4);
                      (((Vec3f *)((long)local_1498.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1498.hit + 8);
                      *(float *)((long)local_1498.ray + 0x3c) = *(float *)(local_1498.hit + 0xc);
                      *(float *)((long)local_1498.ray + 0x40) = *(float *)(local_1498.hit + 0x10);
                      *(float *)((long)local_1498.ray + 0x44) = *(float *)(local_1498.hit + 0x14);
                      *(float *)((long)local_1498.ray + 0x48) = *(float *)(local_1498.hit + 0x18);
                      *(float *)((long)local_1498.ray + 0x4c) = *(float *)(local_1498.hit + 0x1c);
                      *(float *)((long)local_1498.ray + 0x50) = *(float *)(local_1498.hit + 0x20);
                    }
                    else {
                      (*pGVar10->intersectionFilterN)(&local_1498);
                      uVar58 = local_13e0._0_8_;
                      if (*local_1498.valid != 0) goto LAB_011e28ca;
LAB_011e298a:
                      (ray->super_RayK<1>).tfar = (float)local_14e0._0_4_;
                      uVar58 = local_13e0._0_8_;
                    }
                    fVar11 = (ray->super_RayK<1>).tfar;
                    auVar69._4_4_ = fVar11;
                    auVar69._0_4_ = fVar11;
                    auVar69._8_4_ = fVar11;
                    auVar69._12_4_ = fVar11;
                    auVar69._16_4_ = fVar11;
                    auVar69._20_4_ = fVar11;
                    auVar69._24_4_ = fVar11;
                    auVar69._28_4_ = fVar11;
                    *(undefined4 *)(local_1420 + uVar58 * 4) = 0;
                    auVar80 = vcmpps_avx(_local_14c0,auVar69,2);
                    local_1420 = vandps_avx(auVar80,local_1420);
                    uVar60 = (ray->super_RayK<1>).mask;
                    _local_14e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  }
                  if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1420 >> 0x7f,0) == '\0') &&
                        (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1420 >> 0xbf,0) == '\0') &&
                      (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1420[0x1f]) break;
                  local_1500._0_4_ = uVar60;
                  BVHNIntersector1<4,1,true,embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1498);
                  uVar55 = (uint)local_1498.valid;
                  uVar60 = (uint)local_1500;
                } while( true );
              }
            }
            lVar63 = lVar63 + 1;
          } while (lVar63 != local_1468);
        }
        fVar11 = (ray->super_RayK<1>).tfar;
        auVar70 = ZEXT1664(CONCAT412(fVar11,CONCAT48(fVar11,CONCAT44(fVar11,fVar11))));
        auVar138 = ZEXT1664(local_1310);
        auVar143 = ZEXT1664(local_1320);
        auVar165 = ZEXT1664(local_1330);
        auVar179 = ZEXT1664(local_1340);
        auVar181 = ZEXT1664(local_1350);
        auVar192 = ZEXT1664(local_1360);
        auVar206 = ZEXT1664(local_1370);
        auVar208 = ZEXT1664(local_1380);
        auVar210 = ZEXT1664(local_1390);
        auVar135 = ZEXT1664(local_13f0);
      }
    } while (pauVar56 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }